

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O2

int __thiscall booster::aio::reactor::poll(reactor *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  int error;
  
  iVar1 = (*((this->impl_)._M_t.
             super___uniq_ptr_impl<booster::aio::reactor_impl,_std::default_delete<booster::aio::reactor_impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::aio::reactor_impl_*,_std::default_delete<booster::aio::reactor_impl>_>
             .super__Head_base<0UL,_booster::aio::reactor_impl_*,_false>._M_head_impl)->
            _vptr_reactor_impl[1])();
  return iVar1;
}

Assistant:

int reactor::poll(reactor::event *events,int n,int timeout,system::error_code &e) 
	{
		int error = 0;
		int r=impl_->poll(events,n,timeout,error);
		if(error)
			e=system::error_code(error,syscat);
		return r;
	}